

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O2

SQInteger sqstd_rex_list(SQRex *exp)

{
  long lVar1;
  long lVar2;
  SQInteger SVar3;
  SQInteger SVar4;
  
  if (*exp->_p == '^') {
    exp->_p = exp->_p + 1;
    lVar1 = sqstd_rex_newnode(exp,0x10b);
  }
  else {
    lVar1 = -1;
  }
  lVar2 = sqstd_rex_element(exp);
  if (lVar1 != -1) {
    exp->_nodes[lVar1].next = lVar2;
    lVar2 = lVar1;
  }
  SVar3 = lVar2;
  if (*exp->_p == '|') {
    exp->_p = exp->_p + 1;
    SVar3 = sqstd_rex_newnode(exp,0x101);
    exp->_nodes[SVar3].left = lVar2;
    SVar4 = sqstd_rex_list(exp);
    exp->_nodes[SVar3].right = SVar4;
  }
  return SVar3;
}

Assistant:

static SQInteger sqstd_rex_list(SQRex *exp)
{
    SQInteger ret=-1,e;
    if(*exp->_p == SQREX_SYMBOL_BEGINNING_OF_STRING) {
        exp->_p++;
        ret = sqstd_rex_newnode(exp,OP_BOL);
    }
    e = sqstd_rex_element(exp);
    if(ret != -1) {
        exp->_nodes[ret].next = e;
    }
    else ret = e;

    if(*exp->_p == SQREX_SYMBOL_BRANCH) {
        SQInteger temp,tright;
        exp->_p++;
        temp = sqstd_rex_newnode(exp,OP_OR);
        exp->_nodes[temp].left = ret;
        tright = sqstd_rex_list(exp);
        exp->_nodes[temp].right = tright;
        ret = temp;
    }
    return ret;
}